

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O0

void __thiscall Sinc_ZeroHandling_Test::TestBody(Sinc_ZeroHandling_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  float *in_stack_00000010;
  float *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000028;
  AssertionResult gtest_ar_1;
  Float cur_1;
  int i_1;
  AssertionResult gtest_ar;
  Float cur;
  int i;
  Float prev;
  Float x;
  AssertHelper *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  char *in_stack_ffffffffffffff78;
  AssertionResult *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_60;
  Float local_50;
  int local_4c;
  Message *in_stack_ffffffffffffffd8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  int local_14;
  
  for (local_14 = 0; local_14 < 10000; local_14 = local_14 + 1) {
    pbrt::Sinc(0.0);
    in_stack_ffffffffffffff80 = (AssertionResult *)&stack0xffffffffffffffd8;
    testing::internal::CmpHelperLE<float,float>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_ffffffffffffff80);
    in_stack_ffffffffffffff8c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff78 =
           testing::AssertionResult::failure_message((AssertionResult *)0x51550b);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                 &in_stack_ffffffffffffff80->success_,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (char *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffffe0.ptr_,in_stack_ffffffffffffffd8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
      testing::Message::~Message((Message *)0x515559);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x51559c);
    pbrt::NextFloatUp(SUB84(in_stack_ffffffffffffff60,0));
  }
  for (local_4c = 0; local_4c < 10000; local_4c = local_4c + 1) {
    local_50 = pbrt::Sinc(0.0);
    testing::internal::CmpHelperLE<float,float>
              (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!(bool)uVar2) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff60 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5156a7);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                 &in_stack_ffffffffffffff80->success_,
                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                 (char *)CONCAT17(uVar2,in_stack_ffffffffffffff70));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_ffffffffffffffe0.ptr_,in_stack_ffffffffffffffd8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff60);
      testing::Message::~Message((Message *)0x5156f5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x515735);
    pbrt::NextFloatDown(SUB84(in_stack_ffffffffffffff60,0));
  }
  return;
}

Assistant:

TEST(Sinc, ZeroHandling) {
    Float x = 0;
    Float prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatUp(x);
        prev = cur;
    }

    x = -0;
    prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatDown(x);
        prev = cur;
    }
}